

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::
RemoveCurrent<Memory::ArenaAllocator>(EditingIterator *this,ArenaAllocator *allocator)

{
  RealCount *pRVar1;
  DListNodeBase<Memory::CustomHeap::Page> *pDVar2;
  DListNodeBase<Memory::CustomHeap::Page> *pDVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  DListBase<Memory::CustomHeap::Page,_RealCount> *buffer;
  
  buffer = (DListBase<Memory::CustomHeap::Page,_RealCount> *)(this->super_Iterator).current;
  if (buffer == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar5) goto LAB_006a052a;
    *puVar6 = 0;
    buffer = (DListBase<Memory::CustomHeap::Page,_RealCount> *)(this->super_Iterator).current;
  }
  if (buffer == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar5) {
LAB_006a052a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    buffer = (DListBase<Memory::CustomHeap::Page,_RealCount> *)(this->super_Iterator).current;
  }
  pDVar2 = (buffer->super_DListNodeBase<Memory::CustomHeap::Page>).next.base;
  pDVar3 = ((anon_union_8_3_7fb8a913_for_prev *)
           (&(buffer->super_DListNodeBase<Memory::CustomHeap::Page>).next + 1))->base;
  (pDVar3->next).base = pDVar2;
  pDVar2->prev = *(anon_union_8_3_7fb8a913_for_prev *)
                  (&(buffer->super_DListNodeBase<Memory::CustomHeap::Page>).next + 1);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x38);
  (this->super_Iterator).current = pDVar3;
  pRVar1 = &((this->super_Iterator).list)->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }